

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.h
# Opt level: O3

GOESRProduct * __thiscall GOESRProduct::operator=(GOESRProduct *this,GOESRProduct *param_1)

{
  pointer psVar1;
  __syscall_slong_t _Var2;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->files_).
       super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar1 = (param_1->files_).
           super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->files_).
       super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->files_).
       super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->files_).
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->files_).
       super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->files_).
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar1;
  (this->files_).
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->files_).
       super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->files_).
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->files_).
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->files_).
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
  ~vector(&local_28);
  _Var2 = (param_1->frameStart_).tv_nsec;
  (this->frameStart_).tv_sec = (param_1->frameStart_).tv_sec;
  (this->frameStart_).tv_nsec = _Var2;
  std::__cxx11::string::operator=((string *)&this->product_,(string *)&param_1->product_);
  std::__cxx11::string::operator=
            ((string *)&(this->product_).nameLong,(string *)&(param_1->product_).nameLong);
  std::__cxx11::string::operator=((string *)&this->region_,(string *)&param_1->region_);
  std::__cxx11::string::operator=
            ((string *)&(this->region_).nameLong,(string *)&(param_1->region_).nameLong);
  std::__cxx11::string::operator=((string *)&this->channel_,(string *)&param_1->channel_);
  std::__cxx11::string::operator=
            ((string *)&(this->channel_).nameLong,(string *)&(param_1->channel_).nameLong);
  std::__cxx11::string::operator=((string *)&this->satellite_,(string *)&param_1->satellite_);
  this->satelliteID_ = param_1->satelliteID_;
  std::__cxx11::string::operator=((string *)&this->instrument_,(string *)&param_1->instrument_);
  std::__cxx11::string::operator=((string *)&this->imagingMode_,(string *)&param_1->imagingMode_);
  std::__cxx11::string::operator=((string *)&this->resolution_,(string *)&param_1->resolution_);
  this->segmented_ = param_1->segmented_;
  return this;
}

Assistant:

GOESRProduct() = default;